

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGforStageCreation.cpp
# Opt level: O2

void __thiscall
BGforStageCreation::Fill_FirstOHtsI
          (BGforStageCreation *this,PlanningUnitMADPDiscrete *pu,Index ts,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *firstOHtsI)

{
  pointer puVar1;
  int iVar2;
  Index IVar3;
  undefined8 in_RAX;
  undefined4 extraout_var;
  LIndex i;
  Index agI;
  ulong uVar4;
  Index fI;
  undefined8 uStack_38;
  
  puVar1 = (firstOHtsI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((firstOHtsI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (firstOHtsI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  uVar4 = 0;
  uStack_38 = in_RAX;
  while( true ) {
    iVar2 = (*(pu->super_PlanningUnit)._vptr_PlanningUnit[6])(pu);
    if (CONCAT44(extraout_var,iVar2) <= uVar4) break;
    i = PlanningUnitMADPDiscrete::GetFirstObservationHistoryIndex(pu,(Index)uVar4,ts);
    IVar3 = Globals::CastLIndexToIndex(i);
    uStack_38 = CONCAT44(IVar3,(undefined4)uStack_38);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (firstOHtsI,(value_type_conflict1 *)((long)&uStack_38 + 4));
    uVar4 = (ulong)((Index)uVar4 + 1);
  }
  return;
}

Assistant:

void  BGforStageCreation::Fill_FirstOHtsI(
        const PlanningUnitMADPDiscrete* pu,
        Index ts, 
        vector<Index>& firstOHtsI
        )
{
    firstOHtsI.clear();
    //because the OHs are constructed breath-first, we know the OHs for agent i
    //for this time step are numbered:
    //firstOHtsGI[i]...firstOHtsGI[i]+nrOH[i]-1
    //
    //(read first-OH-for-time-step-ts its Global Index)
    //
    //i.e. ohGI = ohI + firstOHtsGI 

    for(Index agI=0; agI < pu->GetNrAgents(); agI++)
    {
        Index fI = CastLIndexToIndex(pu->GetFirstObservationHistoryIndex(agI, ts));
        firstOHtsI.push_back(fI); 
    }
}